

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O2

void __thiscall
TPZGenGrid2D::ElementConnectivity(TPZGenGrid2D *this,int64_t i,TPZVec<long> *rectangle_nodes)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lStack_50;
  long **local_38;
  
  piVar1 = (this->fNx).super_TPZVec<int>.fStore;
  lVar11 = (long)*piVar1;
  uVar7 = i % lVar11;
  lVar6 = (long)piVar1[1];
  uVar8 = (i / lVar11) % lVar6;
  uVar5 = i / (lVar6 * lVar11);
  iVar12 = (int)uVar8;
  iVar4 = (int)uVar7;
  if (this->fMeshType < EHexahedral) {
    iVar3 = (*this->_vptr_TPZGenGrid2D[8])
                      (this,uVar7 & 0xffffffff,uVar8 & 0xffffffff,uVar5 & 0xffffffff);
    *rectangle_nodes->fStore = (long)iVar3;
    iVar3 = (*this->_vptr_TPZGenGrid2D[8])
                      (this,(ulong)(iVar4 + 1U),uVar8 & 0xffffffff,uVar5 & 0xffffffff);
    rectangle_nodes->fStore[1] = (long)iVar3;
    iVar4 = (*this->_vptr_TPZGenGrid2D[8])
                      (this,(ulong)(iVar4 + 1U),(ulong)(iVar12 + 1U),uVar5 & 0xffffffff);
    rectangle_nodes->fStore[2] = (long)iVar4;
    iVar4 = (*this->_vptr_TPZGenGrid2D[8])
                      (this,uVar7 & 0xffffffff,(ulong)(iVar12 + 1U),uVar5 & 0xffffffff);
    lStack_50 = 0x18;
  }
  else {
    if (this->fMeshType != ENoType) {
      return;
    }
    uVar10 = iVar4 * 2;
    uVar13 = iVar12 * 2;
    iVar3 = (*this->_vptr_TPZGenGrid2D[8])(this,(ulong)uVar10,(ulong)uVar13,uVar5 & 0xffffffff);
    *rectangle_nodes->fStore = (long)iVar3;
    uVar2 = iVar4 * 2 + 2;
    iVar3 = (*this->_vptr_TPZGenGrid2D[8])(this,(ulong)uVar2,(ulong)uVar13,uVar5 & 0xffffffff);
    rectangle_nodes->fStore[1] = (long)iVar3;
    uVar9 = iVar12 * 2 + 2;
    iVar3 = (*this->_vptr_TPZGenGrid2D[8])(this,(ulong)uVar2,(ulong)uVar9,uVar5 & 0xffffffff);
    rectangle_nodes->fStore[2] = (long)iVar3;
    iVar3 = (*this->_vptr_TPZGenGrid2D[8])(this,(ulong)uVar10,(ulong)uVar9,uVar5 & 0xffffffff);
    rectangle_nodes->fStore[3] = (long)iVar3;
    uVar14 = iVar4 * 2 + 1;
    iVar4 = (*this->_vptr_TPZGenGrid2D[8])(this,(ulong)uVar14,(ulong)uVar13,uVar5 & 0xffffffff);
    rectangle_nodes->fStore[4] = (long)iVar4;
    uVar13 = iVar12 * 2 + 1;
    iVar4 = (*this->_vptr_TPZGenGrid2D[8])(this,(ulong)uVar2,(ulong)uVar13,uVar5 & 0xffffffff);
    rectangle_nodes->fStore[5] = (long)iVar4;
    iVar4 = (*this->_vptr_TPZGenGrid2D[8])(this,(ulong)uVar14,(ulong)uVar9,uVar5 & 0xffffffff);
    rectangle_nodes->fStore[6] = (long)iVar4;
    iVar4 = (*this->_vptr_TPZGenGrid2D[8])(this,(ulong)uVar10,(ulong)uVar13,uVar5 & 0xffffffff);
    rectangle_nodes->fStore[7] = (long)iVar4;
    iVar4 = (*this->_vptr_TPZGenGrid2D[8])(this,(ulong)uVar14,(ulong)uVar13,uVar5 & 0xffffffff);
    lStack_50 = 0x40;
  }
  local_38 = &rectangle_nodes->fStore;
  *(long *)((long)*local_38 + lStack_50) = (long)iVar4;
  return;
}

Assistant:

void TPZGenGrid2D::ElementConnectivity(int64_t i, TPZVec<int64_t> &rectangle_nodes) {
    int xel = i % (fNx[0]);
    int yel = (i / (fNx[0])) % (fNx[1]);
    int layer = i / (fNx[0] * fNx[1]);
    //cout << "ElConnectivity : xel = " << xel << " yel = " << yel << " layer = " << layer << endl;
    //cout.flush();
    if (fMeshType == MMeshType::EQuadrilateral || fMeshType == MMeshType::ETriangular) {
        rectangle_nodes[0] = GlobalI(xel, yel, layer);
        rectangle_nodes[1] = GlobalI(xel + 1, yel, layer);
        rectangle_nodes[2] = GlobalI(xel + 1, yel + 1, layer);
        rectangle_nodes[3] = GlobalI(xel, yel + 1, layer);
        //cout << "ElConnectivity : " << rectangle_nodes[0] << ' '<< rectangle_nodes[1] << ' '<<rectangle_nodes[2] << ' '<<rectangle_nodes[3] << endl;
        //cout.flush();
    } else if (fMeshType == MMeshType::ENoType) {
        rectangle_nodes[0] = GlobalI(2 * xel, 2 * yel, layer);
        rectangle_nodes[1] = GlobalI(2 * xel + 2, 2 * yel, layer);
        rectangle_nodes[2] = GlobalI(2 * xel + 2, 2 * yel + 2, layer);
        rectangle_nodes[3] = GlobalI(2 * xel, 2 * yel + 2, layer);
        rectangle_nodes[4] = GlobalI(2 * xel + 1, 2 * yel, layer);
        rectangle_nodes[5] = GlobalI(2 * xel + 2, 2 * yel + 1, layer);
        rectangle_nodes[6] = GlobalI(2 * xel + 1, 2 * yel + 2, layer);
        rectangle_nodes[7] = GlobalI(2 * xel, 2 * yel + 1, layer);
        rectangle_nodes[8] = GlobalI(2 * xel + 1, 2 * yel + 1, layer);
    }
}